

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>::truncate
          (ArrayBuilder<kj::MainBuilder::Impl::Arg> *this,char *__file,__off_t __length)

{
  Arg *pAVar1;
  Arg *pAVar2;
  Iface *pIVar3;
  Disposer *pDVar4;
  
  pAVar1 = this->ptr;
  pAVar2 = this->pos;
  while (pAVar1 + (long)__file < pAVar2) {
    this->pos = pAVar2 + -1;
    pIVar3 = pAVar2[-1].callback.impl.ptr;
    if (pIVar3 != (Iface *)0x0) {
      pAVar2[-1].callback.impl.ptr = (Iface *)0x0;
      pDVar4 = pAVar2[-1].callback.impl.disposer;
      (**pDVar4->_vptr_Disposer)(pDVar4,pIVar3->_vptr_Iface[-2] + (long)&pIVar3->_vptr_Iface);
    }
    pAVar2 = this->pos;
  }
  return (int)pAVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }